

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_outward_norm(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL valid;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  ref_grid_local._4_4_ = ref_swap_node23(ref_grid,node0,node1,&valid,&ref_private_macro_code_rss);
  if (ref_grid_local._4_4_ == 0) {
    node2 = ref_private_macro_code_rss;
    nodes[0] = valid;
    node3 = node0;
    ref_grid_local._4_4_ =
         ref_node_tri_twod_orientation(ref_node_00,&node3,&ref_private_macro_code_rss_1);
    if (ref_grid_local._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        node2 = valid;
        nodes[0] = ref_private_macro_code_rss;
        node3 = node1;
        ref_grid_local._4_4_ =
             ref_node_tri_twod_orientation(ref_node_00,&node3,&ref_private_macro_code_rss_1);
        if (ref_grid_local._4_4_ == 0) {
          if (ref_private_macro_code_rss_1 == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            *allowed = 1;
            ref_grid_local._4_4_ = 0;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x1c2,"ref_swap_outward_norm",(ulong)ref_grid_local._4_4_,"valid");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x1bc,
             "ref_swap_outward_norm",(ulong)ref_grid_local._4_4_,"valid");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x1b7,
           "ref_swap_outward_norm",(ulong)ref_grid_local._4_4_,"other nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_swap_outward_norm(REF_GRID ref_grid,
                                                REF_INT node0, REF_INT node1,
                                                REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_BOOL valid;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
  if (!valid) return REF_SUCCESS;

  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
  if (!valid) return REF_SUCCESS;

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}